

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pp_mul.c
# Opt level: O0

void ppDiv(word *q,word *r,word *a,size_t n,word *b,size_t m,void *stack)

{
  word *b_00;
  word *a_00;
  word *pwVar1;
  size_t sVar2;
  ulong uVar3;
  word wVar4;
  size_t in_RCX;
  word *in_RDX;
  word *in_RSI;
  word *in_RDI;
  word *in_R8;
  size_t in_R9;
  word *in_stack_00000008;
  word *w2;
  word *w1;
  word *divisor;
  word *divident;
  size_t i;
  size_t shift;
  word dividentHi;
  size_t in_stack_ffffffffffffff88;
  word *in_stack_ffffffffffffff90;
  word *n_00;
  word *a_01;
  ulong local_48;
  ulong local_30;
  
  a_00 = (word *)wwBitSize(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  pwVar1 = (word *)wwBitSize(a_00,in_stack_ffffffffffffff88);
  b_00 = in_stack_00000008;
  if (a_00 < pwVar1) {
    wwSetZero(in_RDI,(in_RCX - in_R9) + 1);
    wwCopy(in_RSI,in_RDX,in_R9);
  }
  else {
    pwVar1 = in_stack_00000008 + in_RCX + 1;
    a_01 = pwVar1 + in_R9;
    n_00 = a_01 + 0x10;
    in_stack_00000008 = a_01 + 0x20;
    wwCopy(b_00,in_RDX,in_RCX);
    b_00[in_RCX] = 0;
    wwCopy(pwVar1,in_R8,in_R9);
    sVar2 = wwBitSize(a_00,in_stack_ffffffffffffff88);
    if ((sVar2 - 1 & 0x3f) == 0) {
      in_RDI[in_RCX - in_R9] = 0;
      local_30 = in_R9 - 1;
      in_RSI[in_R9 - 1] = 0;
    }
    else {
      wwShHi(a_01,(size_t)n_00,(size_t)a_00);
      wwShHi(a_01,(size_t)n_00,(size_t)a_00);
      local_30 = in_R9;
    }
    *a_01 = 0;
    a_01[1] = 1;
    a_01[2] = a_01[-((long)pwVar1[local_30 - 1] >> 0x3f)] ^ 2;
    a_01[3] = a_01[pwVar1[local_30 - 1] >> 0x3f ^ 1] ^ 2;
    a_01[4] = a_01[pwVar1[local_30 - 1] >> 0x3e] ^ 4;
    a_01[5] = a_01[pwVar1[local_30 - 1] >> 0x3e ^ 1] ^ 4;
    a_01[6] = a_01[pwVar1[local_30 - 1] >> 0x3e ^ 2] ^ 4;
    a_01[7] = a_01[pwVar1[local_30 - 1] >> 0x3e ^ 3] ^ 4;
    a_01[8] = a_01[pwVar1[local_30 - 1] >> 0x3d] ^ 8;
    a_01[9] = a_01[pwVar1[local_30 - 1] >> 0x3d ^ 1] ^ 8;
    a_01[10] = a_01[pwVar1[local_30 - 1] >> 0x3d ^ 2] ^ 8;
    a_01[0xb] = a_01[pwVar1[local_30 - 1] >> 0x3d ^ 3] ^ 8;
    a_01[0xc] = a_01[pwVar1[local_30 - 1] >> 0x3d ^ 4] ^ 8;
    a_01[0xd] = a_01[pwVar1[local_30 - 1] >> 0x3d ^ 5] ^ 8;
    a_01[0xe] = a_01[pwVar1[local_30 - 1] >> 0x3d ^ 6] ^ 8;
    a_01[0xf] = a_01[pwVar1[local_30 - 1] >> 0x3d ^ 7] ^ 8;
    *n_00 = 0;
    n_00[1] = pwVar1[local_30 - 1];
    n_00[2] = n_00[1] << 1;
    n_00[3] = n_00[2] ^ pwVar1[local_30 - 1];
    n_00[4] = n_00[2] << 1;
    n_00[5] = n_00[4] ^ pwVar1[local_30 - 1];
    n_00[6] = n_00[3] << 1;
    n_00[7] = n_00[6] ^ pwVar1[local_30 - 1];
    n_00[8] = n_00[4] << 1;
    n_00[9] = n_00[8] ^ pwVar1[local_30 - 1];
    n_00[10] = n_00[5] << 1;
    n_00[0xb] = n_00[10] ^ pwVar1[local_30 - 1];
    n_00[0xc] = n_00[6] << 1;
    n_00[0xd] = n_00[0xc] ^ pwVar1[local_30 - 1];
    n_00[0xe] = n_00[7] << 1;
    n_00[0xf] = n_00[0xe] ^ pwVar1[local_30 - 1];
    for (local_48 = in_RCX; local_30 <= local_48; local_48 = local_48 - 1) {
      uVar3 = b_00[local_48];
      in_RDI[local_48 - local_30] = a_01[uVar3 >> 0x3c];
      uVar3 = n_00[in_RDI[local_48 - local_30] & 0xf] >> 4 ^ uVar3;
      in_RDI[local_48 - local_30] = in_RDI[local_48 - local_30] << 4 ^ a_01[uVar3 >> 0x38 & 0xf];
      uVar3 = n_00[in_RDI[local_48 - local_30] & 0xf] >> 8 ^ uVar3;
      in_RDI[local_48 - local_30] = in_RDI[local_48 - local_30] << 4 ^ a_01[uVar3 >> 0x34 & 0xf];
      uVar3 = n_00[in_RDI[local_48 - local_30] & 0xf] >> 0xc ^ uVar3;
      in_RDI[local_48 - local_30] = in_RDI[local_48 - local_30] << 4 ^ a_01[uVar3 >> 0x30 & 0xf];
      uVar3 = n_00[in_RDI[local_48 - local_30] & 0xf] >> 0x10 ^ uVar3;
      in_RDI[local_48 - local_30] = in_RDI[local_48 - local_30] << 4 ^ a_01[uVar3 >> 0x2c & 0xf];
      uVar3 = n_00[in_RDI[local_48 - local_30] & 0xf] >> 0x14 ^ uVar3;
      in_RDI[local_48 - local_30] = in_RDI[local_48 - local_30] << 4 ^ a_01[uVar3 >> 0x28 & 0xf];
      uVar3 = n_00[in_RDI[local_48 - local_30] & 0xf] >> 0x18 ^ uVar3;
      in_RDI[local_48 - local_30] = in_RDI[local_48 - local_30] << 4 ^ a_01[uVar3 >> 0x24 & 0xf];
      uVar3 = n_00[in_RDI[local_48 - local_30] & 0xf] >> 0x1c ^ uVar3;
      in_RDI[local_48 - local_30] = in_RDI[local_48 - local_30] << 4 ^ a_01[uVar3 >> 0x20 & 0xf];
      uVar3 = n_00[in_RDI[local_48 - local_30] & 0xf] >> 0x20 ^ uVar3;
      in_RDI[local_48 - local_30] = in_RDI[local_48 - local_30] << 4 ^ a_01[uVar3 >> 0x1c & 0xf];
      uVar3 = n_00[in_RDI[local_48 - local_30] & 0xf] >> 0x24 ^ uVar3;
      in_RDI[local_48 - local_30] = in_RDI[local_48 - local_30] << 4 ^ a_01[uVar3 >> 0x18 & 0xf];
      uVar3 = n_00[in_RDI[local_48 - local_30] & 0xf] >> 0x28 ^ uVar3;
      in_RDI[local_48 - local_30] = in_RDI[local_48 - local_30] << 4 ^ a_01[uVar3 >> 0x14 & 0xf];
      uVar3 = n_00[in_RDI[local_48 - local_30] & 0xf] >> 0x2c ^ uVar3;
      in_RDI[local_48 - local_30] = in_RDI[local_48 - local_30] << 4 ^ a_01[uVar3 >> 0x10 & 0xf];
      uVar3 = n_00[in_RDI[local_48 - local_30] & 0xf] >> 0x30 ^ uVar3;
      in_RDI[local_48 - local_30] = in_RDI[local_48 - local_30] << 4 ^ a_01[uVar3 >> 0xc & 0xf];
      uVar3 = n_00[in_RDI[local_48 - local_30] & 0xf] >> 0x34 ^ uVar3;
      in_RDI[local_48 - local_30] = in_RDI[local_48 - local_30] << 4 ^ a_01[uVar3 >> 8 & 0xf];
      uVar3 = n_00[in_RDI[local_48 - local_30] & 0xf] >> 0x38 ^ uVar3;
      in_RDI[local_48 - local_30] = in_RDI[local_48 - local_30] << 4 ^ a_01[uVar3 >> 4 & 0xf];
      in_RDI[local_48 - local_30] =
           in_RDI[local_48 - local_30] << 4 ^
           a_01[(n_00[in_RDI[local_48 - local_30] & 0xf] >> 0x3c ^ uVar3) & 0xf];
      wVar4 = ppAddMulW(b_00 + (local_48 - local_30),pwVar1,local_30,in_RDI[local_48 - local_30],
                        in_stack_00000008);
      b_00[local_48] = wVar4 ^ b_00[local_48];
      b_00[local_48] = in_RDI[local_48 - local_30] ^ b_00[local_48];
    }
    wwShLo(a_01,(size_t)n_00,(size_t)a_00);
    wwCopy(in_RSI,b_00,local_30);
  }
  return;
}

Assistant:

void ppDiv(word q[], word r[], const word a[], size_t n, const word b[],
	size_t m, void* stack)
{
	register word dividentHi;
	register size_t shift;
	size_t i;
	// переменные в stack
	word* divident;		/* нормализованное делимое (n + 1 слово) */
	word* divisor;		/* нормализованный делитель (m слов) */
	word* w1;			/* таблица частных (16 слов) */
	word* w2;			/* таблица умножения (16 слов) */
	// pre
	ASSERT(n >= m);
	ASSERT(wwIsValid(a, n) && wwIsValid(b, m));
	ASSERT(m > 0 && b[m - 1] > 0);
	ASSERT(wwIsDisjoint2(q, n + 1 - m, r, m));
	ASSERT(a == r || wwIsDisjoint2(a, n, r, m));
	// deg(a) < deg(b)?
	if (wwBitSize(a, n) < wwBitSize(b, m))
	{
		// q <- 0, r <- a
		wwSetZero(q, n - m + 1);
		wwCopy(r, a, m);
		return;
	}
	// резервируем переменные в stack
	divident = (word*)stack;
	divisor = divident + n + 1;
	w1 = divisor + m;
	w2 = w1 + 16;
	stack = w2 + 16;
	// divident <- a
	wwCopy(divident, a, n);
	divident[n] = 0;
	// divisor <- b
	wwCopy(divisor, b, m);
	// нормализация -- сделать старший разряд divisor первым в старшем
	// (возможно неявном) слове
	shift = (wwBitSize(b + m - 1, 1) - 1) % B_PER_W;
	// нормализация не нужна?
	if (shift == 0)
		// обнуляем старшие слова q и r
		q[n - m] = 0, r[--m] = 0;
	else
		// сдвигаем divisor и divident
		shift = B_PER_W - shift,
		wwShHi(divident, n + 1, shift),
		wwShHi(divisor, m, shift);
	// строим таблицы
	_DIV_PRE_S4(w1, divisor[m - 1]);
	_MUL_PRE_S4(w2, divisor[m - 1]);
	// цикл по разрядам делимого
	for (i = n; i >= m; --i)
	{
		// q[i - m] <- divident[i] \div divisor[m - 1]
		dividentHi = divident[i];
		_DIV_DIV_S4(dividentHi, q[i - m], w1, w2);
		// divident <- divident - divisor * X^{i - m} * q[i - m]
		divident[i] ^=
			ppAddMulW(divident + i - m, divisor, m, q[i - m], stack);
		// обработаем неявный старший разряд divisor
		divident[i] ^= q[i - m];
	}
	// денормализация
	wwShLo(divident, n + 1, shift);
	// сохранить остаток
	wwCopy(r, divident, m);
	// очистить регистровые переменные
	shift = 0;
	dividentHi = 0;
}